

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.hh
# Opt level: O2

void __thiscall
avro::parsing::SimpleParser<avro::parsing::ResolvingDecoderHandler>::processImplicitActions
          (SimpleParser<avro::parsing::ResolvingDecoderHandler> *this)

{
  _Elt_pointer pSVar1;
  
  while( true ) {
    pSVar1 = (this->parsingStack).c.
             super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pSVar1 == (this->parsingStack).c.
                  super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_first) {
      pSVar1 = (this->parsingStack).c.
               super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
    }
    if (7 < pSVar1[-1].kind_ - sRecordStart) break;
    ResolvingDecoderHandler::handle(this->handler_,pSVar1 + -1);
    std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::pop_back
              (&(this->parsingStack).c);
  }
  return;
}

Assistant:

void processImplicitActions() {
        for (; ;) {
            Symbol& s = parsingStack.top();
            if (s.isImplicitAction()) {
                handler_.handle(s);
                parsingStack.pop();
            } else {
                break;
            }
        }
    }